

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O0

void GetFrameDesc(Frame *f,DisplayBase display_base,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *results,USBStringContainer *stringDescriptors)

{
  allocator local_781;
  string local_780 [39];
  allocator local_759;
  string local_758 [39];
  allocator local_731;
  string local_730 [39];
  allocator local_709;
  string local_708 [32];
  value_type local_6e8 [39];
  allocator local_6c1;
  string local_6c0 [32];
  string local_6a0 [32];
  value_type local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0 [39];
  allocator local_5b9;
  string local_5b8 [32];
  string local_598 [32];
  value_type local_578 [39];
  allocator local_551;
  string local_550 [32];
  undefined4 local_530;
  allocator local_529;
  int num_bits;
  allocator local_501;
  string local_500 [32];
  value_type local_4e0 [32];
  string local_4c0 [32];
  value_type local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  value_type local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  string local_1d8 [32];
  value_type local_1b8 [32];
  string local_198 [32];
  value_type local_178 [32];
  value_type local_158 [32];
  string local_138 [32];
  value_type local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [48];
  string local_48 [8];
  string result;
  USBStringContainer *stringDescriptors_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *results_local;
  DisplayBase display_base_local;
  Frame *f_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(results);
  if (f[0x20] == (Frame)0x0) {
    std::__cxx11::string::string(local_48);
    if (*(long *)(f + 0x10) == 1) {
      std::__cxx11::string::operator=(local_48,"J");
    }
    else if (*(long *)(f + 0x10) == 0) {
      std::__cxx11::string::operator=(local_48,"K");
    }
    else if (*(long *)(f + 0x10) == 2) {
      std::__cxx11::string::operator=(local_48,"SE0");
    }
    else if (*(long *)(f + 0x10) == 3) {
      std::__cxx11::string::operator=(local_48,"SE1");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_48);
    std::__cxx11::string::~string(local_48);
  }
  else if (f[0x20] == (Frame)0x5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"EOP",&local_79);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  else if (f[0x20] == (Frame)0x6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Reset",&local_a1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  else if (f[0x20] == (Frame)0x9) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Idle",&local_c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  else if (f[0x20] == (Frame)0x1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"SYNC",&local_f1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_f0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  else if (f[0x20] == (Frame)0x2) {
    GetPIDName_abi_cxx11_((USB_PID)local_138);
    std::operator+((char *)local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"PID ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_118);
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string(local_138);
    GetPIDName_abi_cxx11_((USB_PID)local_158);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_158);
    std::__cxx11::string::~string((string *)local_158);
  }
  else if (f[0x20] == (Frame)0x3) {
    int2str_sal_abi_cxx11_((U64)local_198,(DisplayBase)*(undefined8 *)(f + 0x10),display_base);
    std::operator+((char *)local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Frame # ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_178);
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string(local_198);
    int2str_sal_abi_cxx11_((U64)local_1d8,(DisplayBase)*(undefined8 *)(f + 0x10),display_base);
    std::operator+((char *)local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"F # ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_1b8);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"Frame #",&local_1f9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_1f8);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    int2str_sal_abi_cxx11_((U64)local_220,(DisplayBase)*(undefined8 *)(f + 0x10),display_base);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_220);
    std::__cxx11::string::~string((string *)local_220);
  }
  else if (f[0x20] == (Frame)0x4) {
    int2str_sal_abi_cxx11_((U64)local_2a0,(DisplayBase)*(undefined8 *)(f + 0x10),display_base);
    std::operator+((char *)local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x16752d);
    std::operator+(local_260,(char *)local_280);
    int2str_sal_abi_cxx11_((U64)local_2c0,(DisplayBase)*(undefined8 *)(f + 0x18),display_base);
    std::operator+(local_240,local_260);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_240);
    std::__cxx11::string::~string((string *)local_240);
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::string::~string(local_280);
    std::__cxx11::string::~string(local_2a0);
    int2str_sal_abi_cxx11_((U64)local_340,(DisplayBase)*(undefined8 *)(f + 0x10),display_base);
    std::operator+((char *)local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Addr=");
    std::operator+(local_300,(char *)local_320);
    int2str_sal_abi_cxx11_((U64)local_360,(DisplayBase)*(undefined8 *)(f + 0x18),display_base);
    std::operator+(local_2e0,local_300);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_2e0);
    std::__cxx11::string::~string((string *)local_2e0);
    std::__cxx11::string::~string(local_360);
    std::__cxx11::string::~string((string *)local_300);
    std::__cxx11::string::~string(local_320);
    std::__cxx11::string::~string(local_340);
    int2str_sal_abi_cxx11_((U64)local_3e0,(DisplayBase)*(undefined8 *)(f + 0x10),display_base);
    std::operator+((char *)local_3c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"A:");
    std::operator+(local_3a0,(char *)local_3c0);
    int2str_sal_abi_cxx11_((U64)local_400,(DisplayBase)*(undefined8 *)(f + 0x18),display_base);
    std::operator+(local_380,local_3a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_380);
    std::__cxx11::string::~string((string *)local_380);
    std::__cxx11::string::~string(local_400);
    std::__cxx11::string::~string((string *)local_3a0);
    std::__cxx11::string::~string(local_3c0);
    std::__cxx11::string::~string(local_3e0);
    int2str_sal_abi_cxx11_((U64)local_460,(DisplayBase)*(undefined8 *)(f + 0x10),display_base);
    std::operator+(local_440,(char *)local_460);
    int2str_sal_abi_cxx11_((U64)local_480,(DisplayBase)*(undefined8 *)(f + 0x18),display_base);
    std::operator+(local_420,local_440);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_420);
    std::__cxx11::string::~string((string *)local_420);
    std::__cxx11::string::~string(local_480);
    std::__cxx11::string::~string((string *)local_440);
    std::__cxx11::string::~string(local_460);
  }
  else if (f[0x20] == (Frame)0xb) {
    int2str_sal_abi_cxx11_((U64)local_4c0,(DisplayBase)*(undefined8 *)(f + 0x10),display_base);
    std::operator+((char *)local_4a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Byte ");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_4a0);
    std::__cxx11::string::~string((string *)local_4a0);
    std::__cxx11::string::~string(local_4c0);
    int2str_sal_abi_cxx11_((U64)local_4e0,(DisplayBase)*(undefined8 *)(f + 0x10),display_base);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_4e0);
    std::__cxx11::string::~string((string *)local_4e0);
  }
  else if (f[0x20] == (Frame)0xa) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_500,"Keep alive",&local_501);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_500);
    std::__cxx11::string::~string(local_500);
    std::allocator<char>::~allocator((allocator<char> *)&local_501);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&num_bits,"KA",&local_529);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)&num_bits);
    std::__cxx11::string::~string((string *)&num_bits);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
  }
  else if ((f[0x20] == (Frame)0x7) || (f[0x20] == (Frame)0x8)) {
    local_530 = 0x10;
    if (f[0x20] == (Frame)0x7) {
      local_530 = 5;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,"CRC",&local_551);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_550);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    if (*(long *)(f + 0x10) == *(long *)(f + 0x18)) {
      int2str_sal_abi_cxx11_((U64)local_598,(DisplayBase)*(undefined8 *)(f + 0x10),display_base);
      std::operator+((char *)local_578,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"CRC OK ")
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(results,local_578);
      std::__cxx11::string::~string((string *)local_578);
      std::__cxx11::string::~string(local_598);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5b8,"CRC OK",&local_5b9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(results,(value_type *)local_5b8);
      std::__cxx11::string::~string(local_5b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
    }
    else {
      int2str_sal_abi_cxx11_((U64)local_640,(DisplayBase)*(undefined8 *)(f + 0x10),display_base);
      std::operator+((char *)local_620,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "CRC Bad! Rcvd: ");
      std::operator+(local_600,(char *)local_620);
      int2str_sal_abi_cxx11_((U64)local_660,(DisplayBase)*(undefined8 *)(f + 0x18),display_base);
      std::operator+(local_5e0,local_600);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(results,local_5e0);
      std::__cxx11::string::~string((string *)local_5e0);
      std::__cxx11::string::~string(local_660);
      std::__cxx11::string::~string((string *)local_600);
      std::__cxx11::string::~string(local_620);
      std::__cxx11::string::~string(local_640);
      int2str_sal_abi_cxx11_((U64)local_6a0,(DisplayBase)*(undefined8 *)(f + 0x10),display_base);
      std::operator+((char *)local_680,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "CRC Bad! Rcvd: ");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(results,local_680);
      std::__cxx11::string::~string((string *)local_680);
      std::__cxx11::string::~string(local_6a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_6c0,"CRC Bad",&local_6c1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(results,(value_type *)local_6c0);
      std::__cxx11::string::~string(local_6c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
    }
    int2str_sal_abi_cxx11_((U64)local_6e8,(DisplayBase)*(undefined8 *)(f + 0x10),display_base);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,local_6e8);
    std::__cxx11::string::~string((string *)local_6e8);
  }
  else if (f[0x20] == (Frame)0xc) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_708,"Error packet",&local_709);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_708);
    std::__cxx11::string::~string(local_708);
    std::allocator<char>::~allocator((allocator<char> *)&local_709);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_730,"Error",&local_731);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_730);
    std::__cxx11::string::~string(local_730);
    std::allocator<char>::~allocator((allocator<char> *)&local_731);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_758,"Err",&local_759);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_758);
    std::__cxx11::string::~string(local_758);
    std::allocator<char>::~allocator((allocator<char> *)&local_759);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_780,"E",&local_781);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,(value_type *)local_780);
    std::__cxx11::string::~string(local_780);
    std::allocator<char>::~allocator((allocator<char> *)&local_781);
  }
  else if (f[0x20] == (Frame)0xd) {
    GetCtrlTransFrameDesc(f,display_base,results,stringDescriptors);
  }
  else if (f[0x20] == (Frame)0xe) {
    GetHIDReportDescriptorItemFrameDesc(f,display_base,results);
  }
  return;
}

Assistant:

void GetFrameDesc( const Frame& f, DisplayBase display_base, std::vector<std::string>& results,
                   const USBAnalyzerResults::USBStringContainer& stringDescriptors )
{
    results.clear();

    if( f.mType == FT_Signal )
    {
        std::string result;
        if( f.mData1 == S_J )
            result = "J";
        else if( f.mData1 == S_K )
            result = "K";
        else if( f.mData1 == S_SE0 )
            result = "SE0";
        else if( f.mData1 == S_SE1 )
            result = "SE1";

        results.push_back( result );
    }
    else if( f.mType == FT_EOP )
    {
        results.push_back( "EOP" );
    }
    else if( f.mType == FT_Reset )
    {
        results.push_back( "Reset" );
    }
    else if( f.mType == FT_Idle )
    {
        results.push_back( "Idle" );
    }
    else if( f.mType == FT_SYNC )
    {
        results.push_back( "SYNC" );
    }
    else if( f.mType == FT_PID )
    {
        results.push_back( "PID " + GetPIDName( USB_PID( f.mData1 ) ) );
        results.push_back( GetPIDName( USB_PID( f.mData1 ) ) );
    }
    else if( f.mType == FT_FrameNum )
    {
        results.push_back( "Frame # " + int2str_sal( f.mData1, display_base, 11 ) );
        results.push_back( "F # " + int2str_sal( f.mData1, display_base, 11 ) );
        results.push_back( "Frame #" );
        results.push_back( int2str_sal( f.mData1, display_base, 11 ) );
    }
    else if( f.mType == FT_AddrEndp )
    {
        results.push_back( "Address=" + int2str_sal( f.mData1, display_base, 7 ) +
                           " Endpoint=" + int2str_sal( f.mData2, display_base, 5 ) );
        results.push_back( "Addr=" + int2str_sal( f.mData1, display_base, 7 ) + " Endp=" + int2str_sal( f.mData2, display_base, 5 ) );
        results.push_back( "A:" + int2str_sal( f.mData1, display_base, 7 ) + " E:" + int2str_sal( f.mData2, display_base, 5 ) );
        results.push_back( int2str_sal( f.mData1, display_base, 7 ) + " " + int2str_sal( f.mData2, display_base, 5 ) );
    }
    else if( f.mType == FT_Byte )
    {
        results.push_back( "Byte " + int2str_sal( f.mData1, display_base, 8 ) );
        results.push_back( int2str_sal( f.mData1, display_base, 8 ) );
    }
    else if( f.mType == FT_KeepAlive )
    {
        results.push_back( "Keep alive" );
        results.push_back( "KA" );
    }
    else if( f.mType == FT_CRC5 || f.mType == FT_CRC16 )
    {
        const int num_bits = f.mType == FT_CRC5 ? 5 : 16;
        results.push_back( "CRC" );
        if( f.mData1 == f.mData2 )
        {
            results.push_back( "CRC OK " + int2str_sal( f.mData1, display_base, num_bits ) );
            results.push_back( "CRC OK" );
        }
        else
        {
            results.push_back( "CRC Bad! Rcvd: " + int2str_sal( f.mData1, display_base, num_bits ) +
                               " Calc: " + int2str_sal( f.mData2, display_base, num_bits ) );
            results.push_back( "CRC Bad! Rcvd: " + int2str_sal( f.mData1, display_base, num_bits ) );
            results.push_back( "CRC Bad" );
        }

        results.push_back( int2str_sal( f.mData1, display_base, num_bits ) );
    }
    else if( f.mType == FT_Error )
    {
        results.push_back( "Error packet" );
        results.push_back( "Error" );
        results.push_back( "Err" );
        results.push_back( "E" );
    }
    else if( f.mType == FT_ControlTransferField )
    {
        GetCtrlTransFrameDesc( f, display_base, results, stringDescriptors );
    }
    else if( f.mType == FT_HIDReportDescriptorItem )
    {
        GetHIDReportDescriptorItemFrameDesc( f, display_base, results );
    }
}